

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qvariant.cpp
# Opt level: O1

QJsonDocument __thiscall QVariant::toJsonDocument(QVariant *this)

{
  _Head_base<0UL,_QJsonDocumentPrivate_*,_false> _Var1;
  _Head_base<0UL,_QJsonDocumentPrivate_*,_false> _Var2;
  bool bVar3;
  QJsonDocument *in_RSI;
  long in_FS_OFFSET;
  QMetaType local_28;
  QMetaType local_20;
  long local_18;
  
  local_18 = *(long *)(in_FS_OFFSET + 0x28);
  local_20.d_ptr = &QtPrivate::QMetaTypeInterfaceWrapper<QJsonDocument>::metaType;
  local_28.d_ptr =
       (QMetaTypeInterface *)
       ((ulong)in_RSI[3].d._M_t.
               super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>
               ._M_t.
               super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>
               .super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl &
       0xfffffffffffffffc);
  bVar3 = ::comparesEqual(&local_28,&local_20);
  if (bVar3) {
    if ((*(byte *)&in_RSI[3].d._M_t.
                   super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>
                   .super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl & 1) != 0) {
      _Var1._M_head_impl =
           (in_RSI->d)._M_t.
           super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>.
           _M_t.
           super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>
           .super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl;
      in_RSI = (QJsonDocument *)
               ((long)&(_Var1._M_head_impl)->value +
               (long)*(int *)((long)&(_Var1._M_head_impl)->value + 4));
    }
    QJsonDocument::QJsonDocument((QJsonDocument *)this,in_RSI);
  }
  else {
    (this->d).data.shared = (PrivateShared *)&DAT_aaaaaaaaaaaaaaaa;
    QJsonDocument::QJsonDocument((QJsonDocument *)this);
    _Var1._M_head_impl =
         in_RSI[3].d._M_t.
         super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>.
         _M_t.
         super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>.
         super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl;
    if (((ulong)_Var1._M_head_impl & 1) != 0) {
      _Var2._M_head_impl =
           (in_RSI->d)._M_t.
           super___uniq_ptr_impl<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>.
           _M_t.
           super__Tuple_impl<0UL,_QJsonDocumentPrivate_*,_std::default_delete<QJsonDocumentPrivate>_>
           .super__Head_base<0UL,_QJsonDocumentPrivate_*,_false>._M_head_impl;
      in_RSI = (QJsonDocument *)
               ((long)&(_Var2._M_head_impl)->value +
               (long)*(int *)((long)&(_Var2._M_head_impl)->value + 4));
    }
    QMetaType::convert((QMetaTypeInterface *)((ulong)_Var1._M_head_impl & 0xfffffffffffffffc),in_RSI
                       ,local_20,this);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_18) {
    return (unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>)
           (unique_ptr<QJsonDocumentPrivate,_std::default_delete<QJsonDocumentPrivate>_>)this;
  }
  __stack_chk_fail();
}

Assistant:

QJsonDocument QVariant::toJsonDocument() const
{
    return qvariant_cast<QJsonDocument>(*this);
}